

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naivelog.cpp
# Opt level: O2

void __thiscall naivelog::naivelog(naivelog *this)

{
  int iVar1;
  
  iVar1 = open("/tmp/naiveproxy.log",0x441,0x1ed);
  this->logfd = iVar1;
  if (-1 < iVar1) {
    return;
  }
  puts("open log file error");
  exit(-1);
}

Assistant:

naivelog::naivelog()
{
//    int fd = -1;
//初始化 logfd
//当有O_CREAT时，需要使用三个参数。
//使用了O_APPEND标志位时，write是原子操作，可以不加锁
#ifdef USE_O_APPEND
    if ((logfd = open(LOG_FILE_NAME, O_WRONLY | O_CREAT | O_APPEND, 0755)) < 0)
#else
    if ((logfd = open(LOG_FILE_NAME, O_WRONLY | O_CREAT, 0755)) < 0)
#endif
    {
        printf("open log file error\n");
        exit(-1);
    }
}